

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggreports.cpp
# Opt level: O0

void __thiscall
aggreports::WriteLegacyOutput
          (aggreports *this,vector<int,_std::allocator<int>_> *fileIDs,int summary_id,int type,
          int ensemble_id,double retperiod,OASIS_FLOAT loss)

{
  int iVar1;
  size_type sVar2;
  int local_103c;
  char local_1038 [4];
  int strLen;
  char buffer [4096];
  int bufferSize;
  OASIS_FLOAT loss_local;
  double retperiod_local;
  int ensemble_id_local;
  int type_local;
  int summary_id_local;
  vector<int,_std::allocator<int>_> *fileIDs_local;
  aggreports *this_local;
  
  buffer[0xff8] = '\0';
  buffer[0xff9] = '\x10';
  buffer[0xffa] = '\0';
  buffer[0xffb] = '\0';
  buffer._4092_4_ = loss;
  local_103c = snprintf(local_1038,0x1000,"%d,%d,%f,%f",retperiod,(double)loss,
                        (ulong)(uint)summary_id,(ulong)(uint)type);
  sVar2 = std::
          map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
          ::size(&this->ensembletosidx_);
  if (sVar2 != 0) {
    iVar1 = snprintf(local_1038 + local_103c,(long)(0x1000 - local_103c),",%d",
                     (ulong)(uint)ensemble_id);
    local_103c = iVar1 + local_103c;
  }
  iVar1 = snprintf(local_1038 + local_103c,(long)(0x1000 - local_103c),"\n");
  OutputRows(this,fileIDs,local_1038,iVar1 + local_103c);
  return;
}

Assistant:

void aggreports::WriteLegacyOutput(const std::vector<int> &fileIDs,
				   const int summary_id, const int type,
				   const int ensemble_id,
				   const double retperiod,
				   const OASIS_FLOAT loss) {

  const int bufferSize = 4096;
  char buffer[bufferSize];
  int strLen;
  strLen = snprintf(buffer, bufferSize, "%d,%d,%f,%f", summary_id, type,
		    retperiod, loss);
  if (ensembletosidx_.size() > 0) {
    strLen += snprintf(buffer+strLen, bufferSize-strLen, ",%d", ensemble_id);
  }
  strLen += snprintf(buffer+strLen, bufferSize-strLen, "\n");
  OutputRows(fileIDs, buffer, strLen);

}